

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Menu.cpp
# Opt level: O1

void __thiscall Menu::display(Menu *this)

{
  pointer ppVar1;
  undefined1 uVar2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  line(0x23,'-');
  lVar5 = std::cout;
  *(uint *)(getppid + *(long *)(std::cout + -0x18)) =
       *(uint *)(getppid + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)(std::__cxx11::string::operator= + *(long *)(lVar5 + -0x18)) = 0x23;
  lVar5 = *(long *)(lVar5 + -0x18);
  if (*(char *)((long)&std::cin + lVar5 + 1) == '\0') {
    uVar2 = std::ios::widen((char)lVar5 + -0x28);
    *(undefined1 *)((long)&std::cin + lVar5) = uVar2;
    *(undefined1 *)((long)&std::cin + lVar5 + 1) = 1;
  }
  *(undefined1 *)((long)&std::cin + lVar5) = 0x20;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->name)._M_dataplus._M_p,
                      (this->name)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  line(0x23,'-');
  if (0x40 < (ulong)((long)(this->options).
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->options).
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    uVar6 = 1;
    lVar5 = 0x48;
    do {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,". ",2);
      ppVar1 = (this->options).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(this->options).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 6;
      if (uVar4 <= uVar6) goto LAB_001151c9;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,*(char **)((long)ppVar1 + lVar5 + -8),
                          *(long *)((long)&(ppVar1->first)._M_dataplus._M_p + lVar5));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x40;
    } while (uVar6 < (ulong)((long)(this->options).
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->options).
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"0. ",3);
  ppVar1 = (this->options).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->options).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(ppVar1->first)._M_dataplus._M_p,(ppVar1->first)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    return;
  }
  uVar6 = 0;
  uVar4 = 0;
LAB_001151c9:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6,uVar4
            );
}

Assistant:

void Menu::display() {
    line(35);
    cout << left << setw(35) << setfill(' ') << name << endl;
    line(35);
    for (int i = 1; i < options.size(); i++) {
        cout << i << ". " << options.at(i).first << endl;
    }
    // Por convenção, a opção 0 é sempre fechar/voltar
    cout << endl << "0. " << options.at(0).first << endl;
}